

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpkeyhashtable.h
# Opt level: O0

void __thiscall
jrtplib::
RTPKeyHashTable<const_unsigned_int,_jrtplib::RTPInternalSourceData_*,_jrtplib::RTPSources_GetHashIndex,_8317>
::Clear(RTPKeyHashTable<const_unsigned_int,_jrtplib::RTPInternalSourceData_*,_jrtplib::RTPSources_GetHashIndex,_8317>
        *this)

{
  HashElement *pHVar1;
  RTPMemoryManager *mgr;
  int local_24;
  int i;
  HashElement *tmp2;
  HashElement *tmp1;
  RTPKeyHashTable<const_unsigned_int,_jrtplib::RTPInternalSourceData_*,_jrtplib::RTPSources_GetHashIndex,_8317>
  *this_local;
  
  for (local_24 = 0; local_24 < 0x207d; local_24 = local_24 + 1) {
    this->table[local_24] = (HashElement *)0x0;
  }
  tmp2 = this->firsthashelem;
  while (tmp2 != (HashElement *)0x0) {
    pHVar1 = tmp2->listnext;
    mgr = RTPMemoryObject::GetMemoryManager(&this->super_RTPMemoryObject);
    RTPDelete<jrtplib::RTPKeyHashTable<unsigned_int_const,jrtplib::RTPInternalSourceData*,jrtplib::RTPSources_GetHashIndex,8317>::HashElement>
              (tmp2,mgr);
    tmp2 = pHVar1;
  }
  this->firsthashelem = (HashElement *)0x0;
  this->lasthashelem = (HashElement *)0x0;
  return;
}

Assistant:

inline void RTPKeyHashTable<Key,Element,GetIndex,hashsize>::Clear()
{
	HashElement *tmp1,*tmp2;
	
	for (int i = 0 ; i < hashsize ; i++)
		table[i] = 0;
	
	tmp1 = firsthashelem;
	while (tmp1 != 0)
	{
		tmp2 = tmp1->listnext;
		RTPDelete(tmp1,GetMemoryManager());
		tmp1 = tmp2;
	}
	firsthashelem = 0;
	lasthashelem = 0;
}